

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O1

void __thiscall
pfederc::ModExpr::ModExpr(ModExpr *this,Lexer *lexer,Position *pos,Token *tokId,Exprs *exprs)

{
  pointer puVar1;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr;
  pointer puVar2;
  
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__TokenExpr_0012b6c8;
  (this->super_Expr).parent = (Expr *)0x0;
  (this->super_Expr).lexer = lexer;
  (this->super_Expr).type = EXPR_MOD;
  (this->super_Expr).pos.line = pos->line;
  (this->super_Expr).pos.startIndex = pos->startIndex;
  (this->super_Expr).pos.endIndex = pos->endIndex;
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__ModExpr_0012b8d0;
  this->tokId = tokId;
  (this->exprs).
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (exprs->
       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->exprs).
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (exprs->
       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  (this->exprs).
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (exprs->
       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (exprs->
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (exprs->
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (exprs->
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->tokId != (Token *)0x0) {
    puVar1 = (this->exprs).
             super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar2 = (this->exprs).
                  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1)
    {
      ((puVar2->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t
       .super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->parent = &this->super_Expr;
    }
    return;
  }
  __assert_fail("this->tokId",
                "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                ,0x240,
                "pfederc::ModExpr::ModExpr(const Lexer &, const Position &, const Token *, Exprs &&)"
               );
}

Assistant:

ModExpr::ModExpr(const Lexer &lexer, const Position &pos,
    const Token *tokId, Exprs &&exprs) noexcept
    : Expr(lexer, ExprType::EXPR_MOD, pos), tokId{tokId}, exprs(std::move(exprs)) {
  assert(this->tokId);

  _setParents(this->exprs, this);
}